

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O1

bool __thiscall
ExpressionFunctionHandler::addFunction
          (ExpressionFunctionHandler *this,Identifier *name,ExpressionFunction functor,
          size_t minParams,size_t maxParams,ExpFuncSafety safety)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  anon_class_40_2_f5e256a9 executor;
  long *local_90;
  long local_88;
  long local_80 [2];
  ExpressionFunction local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  size_t local_48;
  size_t local_40;
  ExpFuncSafety local_38;
  
  local_90 = local_80;
  pcVar1 = (name->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (name->_name)._M_string_length);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_70 = functor;
  psVar3 = (string *)operator_new(0x28);
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,local_90,local_88 + (long)local_90);
  *(ExpressionFunction *)(psVar3 + 0x20) = local_70;
  pcStack_50 = std::
               _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:60:18)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<ExpressionValue_(const_std::vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/ExpressionFunctionHandler.cpp:60:18)>
             ::_M_manager;
  local_68._M_unused._0_8_ = (undefined8)psVar3;
  local_48 = minParams;
  local_40 = maxParams;
  local_38 = safety;
  bVar2 = registerEntry(this,name,(Entry *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return bVar2;
}

Assistant:

bool ExpressionFunctionHandler::addFunction(const Identifier &name, ExpressionFunction functor, size_t minParams, size_t maxParams, ExpFuncSafety safety)
{
	auto executor = [name, functor](const std::vector<std::unique_ptr<ExpressionInternal>> &parameters) -> ExpressionValue
	{
		// evaluate parameters
		std::vector<ExpressionValue> params;
		params.reserve(parameters.size());

		for (size_t i = 0; i < parameters.size(); i++)
		{
			ExpressionValue result = parameters[i]->evaluate();
			if (!result.isValid())
			{
				Logger::queueError(Logger::Error, "%s: Invalid parameter %d", name, i+1);
				return result;
			}

			params.push_back(result);
		}

		// execute
		return functor(name, params);
	};

	return registerEntry(name, Entry{std::move(executor), minParams, maxParams, safety});
}